

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

Duration * __thiscall absl::Duration::operator+=(Duration *this,Duration rhs)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = rhs.rep_lo_;
  lVar4 = rhs.rep_hi_;
  uVar1 = this->rep_lo_;
  if ((ulong)uVar1 == 0xffffffff) {
    return this;
  }
  if (uVar3 != 0xffffffff) {
    lVar2 = this->rep_hi_;
    this->rep_hi_ = lVar2 + lVar4;
    if ((long)(4000000000 - (ulong)uVar3) <= (long)(ulong)uVar1) {
      this->rep_hi_ = lVar2 + lVar4 + 1;
      this->rep_lo_ = uVar1 + 0x1194d800;
    }
    this->rep_lo_ = this->rep_lo_ + uVar3;
    if (lVar4 < 0) {
      if (this->rep_hi_ <= lVar2) {
        return this;
      }
      uVar3 = 0xffffffff;
      lVar4 = -0x8000000000000000;
    }
    else {
      if (lVar2 <= this->rep_hi_) {
        return this;
      }
      uVar3 = 0xffffffff;
      lVar4 = 0x7fffffffffffffff;
    }
  }
  this->rep_hi_ = lVar4;
  this->rep_lo_ = uVar3;
  return this;
}

Assistant:

Duration& Duration::operator+=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) return *this = rhs;
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) + EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ >= kTicksPerSecond - rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) + 1);
    rep_lo_ -= kTicksPerSecond;
  }
  rep_lo_ += rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ > orig_rep_hi : rep_hi_ < orig_rep_hi) {
    return *this = rhs.rep_hi_ < 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}